

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_gstream.c
# Opt level: O3

HTS_Boolean
HTS_GStreamSet_create
          (HTS_GStreamSet *gss,HTS_PStreamSet *pss,size_t stage,HTS_Boolean use_log_gain,
          size_t sampling_rate,size_t fperiod,double alpha,double beta,HTS_Boolean *stop,
          double volume,HTS_Audio *audio)

{
  undefined1 auVar1 [16];
  HTS_Boolean HVar2;
  size_t sVar3;
  HTS_GStream *pHVar4;
  size_t sVar5;
  double **ppdVar6;
  double *pdVar7;
  long lVar8;
  char *message;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  HTS_Vocoder v;
  HTS_Vocoder local_130;
  
  if ((gss->gstream != (HTS_GStream *)0x0) || (gss->gspeech != (double *)0x0)) {
    HTS_error(1,"HTS_GStreamSet_create: HTS_GStreamSet is not initialized.\n");
    return '\0';
  }
  sVar3 = HTS_PStreamSet_get_nstream(pss);
  gss->nstream = sVar3;
  sVar3 = HTS_PStreamSet_get_total_frame(pss);
  gss->total_frame = sVar3;
  gss->total_nsample = sVar3 * fperiod;
  pHVar4 = (HTS_GStream *)HTS_calloc(gss->nstream,0x10);
  gss->gstream = pHVar4;
  if (gss->nstream != 0) {
    sVar3 = 0;
    do {
      sVar5 = HTS_PStreamSet_get_vector_length(pss,sVar3);
      gss->gstream[sVar3].vector_length = sVar5;
      ppdVar6 = (double **)HTS_calloc(gss->total_frame,8);
      gss->gstream[sVar3].par = ppdVar6;
      if (gss->total_frame != 0) {
        uVar10 = 0;
        do {
          pdVar7 = (double *)HTS_calloc(gss->gstream[sVar3].vector_length,8);
          gss->gstream[sVar3].par[uVar10] = pdVar7;
          uVar10 = uVar10 + 1;
        } while (uVar10 < gss->total_frame);
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 < gss->nstream);
  }
  pdVar7 = (double *)HTS_calloc(gss->total_nsample,8);
  gss->gspeech = pdVar7;
  if (gss->nstream != 0) {
    sVar3 = 0;
    do {
      HVar2 = HTS_PStreamSet_is_msd(pss,sVar3);
      uVar10 = gss->total_frame;
      if (HVar2 == '\0') {
        if (uVar10 != 0) {
          pHVar4 = gss->gstream;
          sVar5 = 0;
          do {
            if (pHVar4[sVar3].vector_length != 0) {
              sVar9 = 0;
              do {
                dVar12 = HTS_PStreamSet_get_parameter(pss,sVar3,sVar5,sVar9);
                pHVar4 = gss->gstream;
                pHVar4[sVar3].par[sVar5][sVar9] = dVar12;
                sVar9 = sVar9 + 1;
              } while (sVar9 < pHVar4[sVar3].vector_length);
              uVar10 = gss->total_frame;
            }
            sVar5 = sVar5 + 1;
          } while (sVar5 < uVar10);
        }
      }
      else if (uVar10 != 0) {
        sVar5 = 0;
        sVar9 = 0;
        do {
          HVar2 = HTS_PStreamSet_get_msd_flag(pss,sVar3,sVar9);
          auVar1 = _DAT_00181100;
          sVar11 = gss->gstream[sVar3].vector_length;
          if (HVar2 == '\x01') {
            if (sVar11 != 0) {
              sVar11 = 0;
              do {
                dVar12 = HTS_PStreamSet_get_parameter(pss,sVar3,sVar5,sVar11);
                pHVar4 = gss->gstream;
                pHVar4[sVar3].par[sVar9][sVar11] = dVar12;
                sVar11 = sVar11 + 1;
              } while (sVar11 < pHVar4[sVar3].vector_length);
            }
            sVar5 = sVar5 + 1;
          }
          else if (sVar11 != 0) {
            pdVar7 = gss->gstream[sVar3].par[sVar9];
            lVar8 = sVar11 - 1;
            auVar13._8_4_ = (int)lVar8;
            auVar13._0_8_ = lVar8;
            auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
            auVar13 = auVar13 ^ _DAT_00181100;
            uVar10 = 0;
            auVar14 = _DAT_001810f0;
            do {
              auVar15 = auVar14 ^ auVar1;
              if ((bool)(~(auVar13._4_4_ < auVar15._4_4_ ||
                          auVar13._0_4_ < auVar15._0_4_ && auVar15._4_4_ == auVar13._4_4_) & 1)) {
                pdVar7[uVar10] = -10000000000.0;
              }
              if (auVar15._12_4_ <= auVar13._12_4_ &&
                  (auVar15._8_4_ <= auVar13._8_4_ || auVar15._12_4_ != auVar13._12_4_)) {
                pdVar7[uVar10 + 1] = -10000000000.0;
              }
              uVar10 = uVar10 + 2;
              lVar8 = auVar14._8_8_;
              auVar14._0_8_ = auVar14._0_8_ + 2;
              auVar14._8_8_ = lVar8 + 2;
            } while ((sVar11 + 1 & 0xfffffffffffffffe) != uVar10);
          }
          sVar9 = sVar9 + 1;
        } while (sVar9 < gss->total_frame);
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 < gss->nstream);
    if ((gss->nstream & 0xfffffffffffffffe) == 2) {
      sVar3 = HTS_PStreamSet_get_vector_length(pss,1);
      if (sVar3 == 1) {
        if ((gss->nstream < 3) || ((gss->gstream[2].vector_length & 1) != 0)) {
          HTS_Vocoder_initialize
                    (&local_130,gss->gstream->vector_length - 1,stage,use_log_gain,sampling_rate,
                     fperiod);
          if (gss->nstream < 3) {
            sVar3 = 0;
          }
          else {
            sVar3 = gss->gstream[2].vector_length;
          }
          if (gss->total_frame != 0) {
            lVar8 = 0;
            pdVar7 = (double *)0x0;
            uVar10 = 0;
            do {
              if (*stop != '\0') break;
              pHVar4 = gss->gstream;
              if (2 < gss->nstream) {
                pdVar7 = pHVar4[2].par[uVar10];
              }
              HTS_Vocoder_synthesize
                        (&local_130,pHVar4->vector_length - 1,*pHVar4[1].par[uVar10],
                         pHVar4->par[uVar10],sVar3,pdVar7,alpha,beta,volume,
                         (double *)((long)gss->gspeech + lVar8),audio);
              uVar10 = uVar10 + 1;
              lVar8 = lVar8 + fperiod * 8;
            } while (uVar10 < gss->total_frame);
          }
          HTS_Vocoder_clear(&local_130);
          if (audio == (HTS_Audio *)0x0) {
            return '\x01';
          }
          HTS_Audio_flush(audio);
          return '\x01';
        }
        message = 
        "HTS_GStreamSet_create: The number of low-pass filter coefficient should be odd numbers.";
      }
      else {
        message = "HTS_GStreamSet_create: The size of lf0 static vector should be 1.\n";
      }
      goto LAB_0017d2c3;
    }
  }
  message = "HTS_GStreamSet_create: The number of streams should be 2 or 3.\n";
LAB_0017d2c3:
  HTS_error(1,message);
  HTS_GStreamSet_clear(gss);
  return '\0';
}

Assistant:

HTS_Boolean HTS_GStreamSet_create(HTS_GStreamSet * gss, HTS_PStreamSet * pss, size_t stage, HTS_Boolean use_log_gain, size_t sampling_rate, size_t fperiod, double alpha, double beta, HTS_Boolean * stop, double volume, HTS_Audio * audio)
{
   size_t i, j, k;
   size_t msd_frame;
   HTS_Vocoder v;
   size_t nlpf = 0;
   double *lpf = NULL;

   /* check */
   if (gss->gstream || gss->gspeech) {
      HTS_error(1, "HTS_GStreamSet_create: HTS_GStreamSet is not initialized.\n");
      return FALSE;
   }

   /* initialize */
   gss->nstream = HTS_PStreamSet_get_nstream(pss);
   gss->total_frame = HTS_PStreamSet_get_total_frame(pss);
   gss->total_nsample = fperiod * gss->total_frame;
   gss->gstream = (HTS_GStream *) HTS_calloc(gss->nstream, sizeof(HTS_GStream));
   for (i = 0; i < gss->nstream; i++) {
      gss->gstream[i].vector_length = HTS_PStreamSet_get_vector_length(pss, i);
      gss->gstream[i].par = (double **) HTS_calloc(gss->total_frame, sizeof(double *));
      for (j = 0; j < gss->total_frame; j++)
         gss->gstream[i].par[j] = (double *) HTS_calloc(gss->gstream[i].vector_length, sizeof(double));
   }
   gss->gspeech = (double *) HTS_calloc(gss->total_nsample, sizeof(double));

   /* copy generated parameter */
   for (i = 0; i < gss->nstream; i++) {
      if (HTS_PStreamSet_is_msd(pss, i)) {      /* for MSD */
         for (j = 0, msd_frame = 0; j < gss->total_frame; j++)
            if (HTS_PStreamSet_get_msd_flag(pss, i, j) == TRUE) {
               for (k = 0; k < gss->gstream[i].vector_length; k++)
                  gss->gstream[i].par[j][k] = HTS_PStreamSet_get_parameter(pss, i, msd_frame, k);
               msd_frame++;
            } else
               for (k = 0; k < gss->gstream[i].vector_length; k++)
                  gss->gstream[i].par[j][k] = HTS_NODATA;
      } else {                  /* for non MSD */
         for (j = 0; j < gss->total_frame; j++)
            for (k = 0; k < gss->gstream[i].vector_length; k++)
               gss->gstream[i].par[j][k] = HTS_PStreamSet_get_parameter(pss, i, j, k);
      }
   }

   /* check */
   if (gss->nstream != 2 && gss->nstream != 3) {
      HTS_error(1, "HTS_GStreamSet_create: The number of streams should be 2 or 3.\n");
      HTS_GStreamSet_clear(gss);
      return FALSE;
   }
   if (HTS_PStreamSet_get_vector_length(pss, 1) != 1) {
      HTS_error(1, "HTS_GStreamSet_create: The size of lf0 static vector should be 1.\n");
      HTS_GStreamSet_clear(gss);
      return FALSE;
   }
   if (gss->nstream >= 3 && gss->gstream[2].vector_length % 2 == 0) {
      HTS_error(1, "HTS_GStreamSet_create: The number of low-pass filter coefficient should be odd numbers.");
      HTS_GStreamSet_clear(gss);
      return FALSE;
   }

   /* synthesize speech waveform */
   HTS_Vocoder_initialize(&v, gss->gstream[0].vector_length - 1, stage, use_log_gain, sampling_rate, fperiod);
   if (gss->nstream >= 3)
      nlpf = gss->gstream[2].vector_length;
   for (i = 0; i < gss->total_frame && (*stop) == FALSE; i++) {
      j = i * fperiod;
      if (gss->nstream >= 3)
         lpf = &gss->gstream[2].par[i][0];
      HTS_Vocoder_synthesize(&v, gss->gstream[0].vector_length - 1, gss->gstream[1].par[i][0], &gss->gstream[0].par[i][0], nlpf, lpf, alpha, beta, volume, &gss->gspeech[j], audio);
   }
   HTS_Vocoder_clear(&v);
   if (audio)
      HTS_Audio_flush(audio);

   return TRUE;
}